

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

void time_boost<boost::random::lagged_fibonacci_01_engine<double,48,19937u,9842u>>
               (lagged_fibonacci_01_engine<double,_48,_19937U,_9842U> *r,string *name)

{
  result_type_conflict1 rVar1;
  stringstream s;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  while (name->_M_string_length < 0x20) {
    std::__cxx11::string::push_back((char)name);
  }
  std::operator<<((ostream *)&std::cout,(string *)name);
  rVar1 = time_plain<boost::random::lagged_fibonacci_01_engine<double,48,19937u,9842u>>(r);
  std::ostream::_M_insert<double>(rVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return;
}

Assistant:

void time_boost(R &r, std::string name) {
  std::stringstream s;  // write data to stream to prevent that code gets optimized away
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  const auto res_plain = time_plain(r);
  s << res_plain;
  std::cout << std::endl;
}